

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_NextCube(DdGen *gen,int **cube,double *value)

{
  DdManager *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  bool bVar4;
  DdManager *dd;
  DdNode *preg;
  DdNode *prev;
  DdNode *nreg;
  DdNode *next;
  DdNode *treg;
  DdNode *top;
  double *value_local;
  int **cube_local;
  DdGen *gen_local;
  
  pDVar1 = gen->manager;
  do {
    if ((gen->stack).sp == 1) {
      gen->status = 0;
      (gen->stack).sp = (gen->stack).sp + -1;
LAB_00a79b88:
      bVar4 = gen->status != 0;
      if (bVar4) {
        *cube = (gen->gen).cubes.cube;
        *value = (gen->gen).cubes.value;
      }
      gen_local._4_4_ = (uint)bVar4;
      return gen_local._4_4_;
    }
    pDVar3 = (gen->stack).stack[(gen->stack).sp + -2];
    pDVar2 = (DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe);
    nreg = (pDVar2->type).kids.T;
    if (pDVar3 != pDVar2) {
      nreg = (DdNode *)((ulong)nreg ^ 1);
    }
    if (nreg != (gen->stack).stack[(gen->stack).sp + -1]) {
      (gen->gen).cubes.cube[pDVar2->index] = 1;
      (gen->stack).stack[(gen->stack).sp + -1] = nreg;
      while( true ) {
        while( true ) {
          treg = (gen->stack).stack[(gen->stack).sp + -1];
          pDVar3 = (DdNode *)((ulong)treg & 0xfffffffffffffffe);
          if (pDVar3->index == 0x7fffffff) break;
          (gen->gen).cubes.cube[pDVar3->index] = 0;
          nreg = (pDVar3->type).kids.E;
          if (treg != pDVar3) {
            nreg = (DdNode *)((ulong)nreg ^ 1);
          }
          (gen->stack).stack[(gen->stack).sp] = nreg;
          (gen->stack).sp = (gen->stack).sp + 1;
        }
        if ((treg != (DdNode *)((ulong)pDVar1->one ^ 1)) && (treg != pDVar1->background)) break;
        while( true ) {
          if ((gen->stack).sp == 1) {
            gen->status = 0;
            (gen->stack).sp = (gen->stack).sp + -1;
            goto LAB_00a79b88;
          }
          pDVar3 = (gen->stack).stack[(gen->stack).sp + -2];
          pDVar2 = (DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe);
          nreg = (pDVar2->type).kids.T;
          if (pDVar3 != pDVar2) {
            nreg = (DdNode *)((ulong)nreg ^ 1);
          }
          if (nreg != treg) break;
          (gen->gen).cubes.cube[pDVar2->index] = 2;
          (gen->stack).sp = (gen->stack).sp + -1;
          treg = (gen->stack).stack[(gen->stack).sp + -1];
        }
        (gen->gen).cubes.cube[pDVar2->index] = 1;
        (gen->stack).stack[(gen->stack).sp + -1] = nreg;
      }
      gen->status = 1;
      (gen->gen).cubes.value = (treg->type).value;
      goto LAB_00a79b88;
    }
    (gen->gen).cubes.cube[pDVar2->index] = 2;
    (gen->stack).sp = (gen->stack).sp + -1;
  } while( true );
}

Assistant:

int
Cudd_NextCube(
  DdGen * gen,
  int ** cube,
  CUDD_VALUE_TYPE * value)
{
    DdNode *top, *treg, *next, *nreg, *prev, *preg;
    DdManager *dd = gen->manager;

    /* Backtrack from previously reached terminal node. */
    while (1) {
        if (gen->stack.sp == 1) {
            /* The current node has no predecessor. */
            gen->status = CUDD_GEN_EMPTY;
            gen->stack.sp--;
            goto done;
        }
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        prev = gen->stack.stack[gen->stack.sp-2];
        preg = Cudd_Regular(prev);
        nreg = cuddT(preg);
        if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
        if (next != top) { /* follow the then branch next */
            gen->gen.cubes.cube[preg->index] = 1;
            gen->stack.stack[gen->stack.sp-1] = next;
            break;
        }
        /* Pop the stack and try again. */
        gen->gen.cubes.cube[preg->index] = 2;
        gen->stack.sp--;
    }

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        if (!cuddIsConstant(treg)) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[treg->index] = 0;
            next = cuddE(treg);
            if (top != treg) next = Cudd_Not(next);
            gen->stack.stack[gen->stack.sp] = next; gen->stack.sp++;
        } else if (top == Cudd_Not(DD_ONE(dd)) || top == dd->background) {
            /* Backtrack */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = gen->stack.stack[gen->stack.sp-2];
                preg = Cudd_Regular(prev);
                nreg = cuddT(preg);
                if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[preg->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[preg->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
                treg = Cudd_Regular(top);
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(top);
            goto done;
        }
    }

done:
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *cube = gen->gen.cubes.cube;
    *value = gen->gen.cubes.value;
    return(1);

}